

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitivePacket.cpp
# Opt level: O2

void __thiscall
rr::GeometryEmitter::EmitVertex
          (GeometryEmitter *this,Vec4 *position,float pointSize,GenericVec4 *varyings,
          int primitiveID)

{
  undefined8 uVar1;
  ulong uVar2;
  long lVar3;
  VertexPacket *packet;
  VertexPacket *local_28;
  
  uVar2 = this->m_numEmitted + 1;
  this->m_numEmitted = uVar2;
  if (uVar2 <= this->m_maxVertices) {
    local_28 = VertexPacketAllocator::alloc(this->m_vpalloc);
    uVar1 = *(undefined8 *)(position->m_data + 2);
    *(undefined8 *)(local_28->position).m_data = *(undefined8 *)position->m_data;
    *(undefined8 *)((local_28->position).m_data + 2) = uVar1;
    local_28->pointSize = pointSize;
    local_28->primitiveID = primitiveID;
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < this->m_vpalloc->m_numberOfVertexOutputs; uVar2 = uVar2 + 1) {
      *(undefined4 *)((long)&local_28->outputs[0].v + lVar3) =
           *(undefined4 *)((long)&varyings->v + lVar3);
      *(undefined4 *)((long)&local_28->outputs[0].v + lVar3 + 4) =
           *(undefined4 *)((long)&varyings->v + lVar3 + 4);
      *(undefined4 *)((long)&local_28->outputs[0].v + lVar3 + 8) =
           *(undefined4 *)((long)&varyings->v + lVar3 + 8);
      *(undefined4 *)((long)&local_28->outputs[0].v + lVar3 + 0xc) =
           *(undefined4 *)((long)&varyings->v + lVar3 + 0xc);
      lVar3 = lVar3 + 0x10;
    }
    std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::push_back
              (&this->m_emitted,&local_28);
  }
  return;
}

Assistant:

void GeometryEmitter::EmitVertex (const tcu::Vec4& position, float pointSize, const GenericVec4* varyings, int primitiveID)
{
	VertexPacket* packet;

	if (++m_numEmitted > m_maxVertices)
	{
		DE_FATAL("Undefined results, too many vertices emitted.");
		return;
	}

	packet = m_vpalloc.alloc();

	packet->position = position;
	packet->pointSize = pointSize;
	packet->primitiveID = primitiveID;

	for (size_t ndx = 0; ndx < m_vpalloc.getNumVertexOutputs(); ++ndx)
		packet->outputs[ndx] = varyings[ndx];

	m_emitted.push_back(packet);
}